

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O1

void __thiscall icu_63::FCDUIterCollationIterator::switchToForward(FCDUIterCollationIterator *this)

{
  State SVar1;
  UCharIterator *pUVar2;
  int32_t iVar3;
  State SVar4;
  
  SVar1 = this->state;
  if (SVar1 == IN_NORM_ITER_AT_START) {
    pUVar2 = (this->super_UIterCollationIterator).iter;
    (*pUVar2->move)(pUVar2,this->limit - this->start,UITER_CURRENT);
  }
  else {
    SVar4 = ITER_CHECK_FWD;
    if (SVar1 == ITER_IN_FCD_SEGMENT) goto LAB_00227df5;
    if (SVar1 == ITER_CHECK_BWD) {
      pUVar2 = (this->super_UIterCollationIterator).iter;
      iVar3 = (*pUVar2->getIndex)(pUVar2,UITER_CURRENT);
      this->pos = iVar3;
      this->start = iVar3;
      SVar4 = (uint)(iVar3 != this->limit) * 2;
      goto LAB_00227df5;
    }
  }
  this->start = this->limit;
  SVar4 = ITER_CHECK_FWD;
LAB_00227df5:
  this->state = SVar4;
  return;
}

Assistant:

void
FCDUIterCollationIterator::switchToForward() {
    U_ASSERT(state == ITER_CHECK_BWD ||
             (state == ITER_IN_FCD_SEGMENT && pos == limit) ||
             (state >= IN_NORM_ITER_AT_LIMIT && pos == normalized.length()));
    if(state == ITER_CHECK_BWD) {
        // Turn around from backward checking.
        start = pos = iter.getIndex(&iter, UITER_CURRENT);
        if(pos == limit) {
            state = ITER_CHECK_FWD;  // Check forward.
        } else {  // pos < limit
            state = ITER_IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the end of the FCD segment.
        if(state == ITER_IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it forward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking forward from it.
            if(state == IN_NORM_ITER_AT_START) {
                iter.move(&iter, limit - start, UITER_CURRENT);
            }
            start = limit;
        }
        state = ITER_CHECK_FWD;
    }
}